

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

void __thiscall
PDFDocumentHandler::RegisterResourcesForResourcesCategory
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          ICategoryServicesCommand *inCommand,PDFDictionary *inResourcesDictionary,
          ObjectIDTypeList *ioObjectsToLaterCopy,StringToStringMap *ioMappedResourcesNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  DocumentContext *this_00;
  iteratorType iVar5;
  PDFParser *pPVar6;
  EPDFObjectType EVar7;
  PDFObject *inOriginal;
  _Base_ptr p_Var8;
  ResourceCopierTask *this_01;
  IndirectObjectsReferenceRegistry *this_02;
  ObjectsContext *pOVar9;
  _List_node_base *p_Var10;
  string *psVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  undefined8 this_03;
  PDFParser *pPVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary;
  string local_118;
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  _Rb_tree_node_base local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  RefCountPtr<PDFDictionary> local_70;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  *local_60;
  PDFParser *local_58;
  string local_50;
  
  pPVar14 = this->mParser;
  local_80._M_allocated_capacity = (size_type)ioMappedResourcesNames;
  local_80._8_8_ = inTargetFormXObject;
  local_58 = (PDFParser *)ioObjectsToLaterCopy;
  (*inCommand->_vptr_ICategoryServicesCommand[2])((string *)local_d8,inCommand);
  inOriginal = PDFParser::QueryDictionaryObject(pPVar14,inResourcesDictionary,(string *)local_d8);
  local_70.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
  if ((_Rb_tree_node_base *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  if (((PDFParser *)local_70.mValue != (PDFParser *)0x0) &&
     (pPVar14 = (PDFParser *)local_70.mValue, PDFDictionary::GetIterator(&local_98,local_70.mValue),
     local_98.
     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
     .mCurrentPosition._M_node !=
     local_98.
     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
     .mEndPosition._M_node)) {
    local_60 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                *)&this->mSourceToTarget;
    p_Var2 = &(this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header;
    do {
      iVar5._M_node =
           local_98.
           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
           .mEndPosition._M_node;
      if (local_98.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove == true) {
        local_98.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mFirstMove = false;
      }
      else {
        local_98.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node =
             (_Base_ptr)
             std::_Rb_tree_increment
                       (local_98.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        .mCurrentPosition._M_node);
        if (local_98.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node == iVar5._M_node) break;
      }
      EVar7 = PDFObject::GetType((PDFObject *)
                                 local_98.
                                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                 .mCurrentPosition._M_node[1]._M_parent);
      if (EVar7 == ePDFObjectIndirectObjectReference) {
        p_Var4 = local_98.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mCurrentPosition._M_node[1]._M_parent;
        p_Var12 = (this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var2->_M_header;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            bVar15 = *(_Base_ptr *)(p_Var12 + 1) < p_Var4[2]._M_parent;
            pPVar14 = (PDFParser *)(ulong)bVar15;
            if (!bVar15) {
              p_Var8 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[(long)pPVar14];
          } while (p_Var12 != (_Base_ptr)0x0);
        }
        p_Var13 = p_Var2;
        if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
           (p_Var13 = (_Rb_tree_header *)p_Var8,
           p_Var4[2]._M_parent < (_Base_ptr)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var13 = p_Var2;
        }
        if (p_Var13 == p_Var2) {
          this_02 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          pOVar9 = (ObjectsContext *)IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_02);
          local_d8._0_8_ = p_Var4[2]._M_parent;
          local_d8._8_8_ = pOVar9;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_long>>
                    (local_60,(pair<const_unsigned_long,_unsigned_long> *)local_d8);
          p_Var10 = (_List_node_base *)operator_new(0x18);
          pPVar6 = local_58;
          p_Var10[1]._M_next = (_List_node_base *)p_Var4[2]._M_parent;
          pPVar14 = local_58;
          std::__detail::_List_node_base::_M_hook(p_Var10);
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(pPVar6->mObjectParser).mTokenizer.mHasTokenBuffer;
          paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity + 1;
        }
        else {
          pOVar9 = *(ObjectsContext **)(p_Var13 + 1);
        }
        psVar11 = PDFName::GetValue_abi_cxx11_
                            (*(PDFName **)
                              (local_98.
                               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               .mCurrentPosition._M_node + 1));
        AsEncodedName((string *)local_f8,(PDFDocumentHandler *)pPVar14,psVar11);
        (*inCommand->_vptr_ICategoryServicesCommand[3])(&local_118,inCommand,pOVar9);
        local_d8._0_8_ = &local_c8;
        p_Var3 = (_Rb_tree_node_base *)(local_f8 + 0x10);
        if ((_Rb_tree_node_base *)local_f8._0_8_ == p_Var3) {
          local_c8._M_parent = (_Base_ptr)local_f8._24_8_;
        }
        else {
          local_d8._0_8_ = local_f8._0_8_;
        }
        local_c8._1_7_ = local_f8._17_7_;
        local_c8._M_color._0_1_ = local_f8[0x10];
        local_d8._8_8_ = local_f8._8_8_;
        local_f8._8_8_ = (ObjectsContext *)0x0;
        local_f8[0x10] = '\0';
        local_c8._M_left = (_Base_ptr)&local_a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == &local_118.field_2) {
          local_a8._8_8_ = local_118.field_2._8_8_;
        }
        else {
          local_c8._M_left = (_Base_ptr)local_118._M_dataplus._M_p;
        }
        local_a8._M_allocated_capacity._1_7_ = local_118.field_2._M_allocated_capacity._1_7_;
        local_a8._M_local_buf[0] = local_118.field_2._M_local_buf[0];
        local_c8._M_right = (_Base_ptr)local_118._M_string_length;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        pPVar14 = (PDFParser *)local_d8;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_f8._0_8_ = p_Var3;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_80._M_allocated_capacity,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pPVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_left != &local_a8) {
          pPVar14 = (PDFParser *)(local_a8._M_allocated_capacity + 1);
          operator_delete(local_c8._M_left,(ulong)pPVar14);
        }
        if ((_Rb_tree_node_base *)local_d8._0_8_ != &local_c8) {
          pPVar14 = (PDFParser *)(local_c8._0_8_ + 1);
          operator_delete((void *)local_d8._0_8_,(ulong)pPVar14);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          pPVar14 = (PDFParser *)
                    (CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                              local_118.field_2._M_local_buf[0]) + 1);
          operator_delete(local_118._M_dataplus._M_p,(ulong)pPVar14);
        }
        if ((_Rb_tree_node_base *)local_f8._0_8_ != p_Var3) {
          pPVar14 = (PDFParser *)(CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
          operator_delete((void *)local_f8._0_8_,(ulong)pPVar14);
        }
      }
      else {
        this_01 = (ResourceCopierTask *)operator_new(0x40);
        this_03 = local_80._8_8_;
        ResourceCopierTask::ResourceCopierTask
                  (this_01,(PDFFormXObject *)local_80._8_8_,this,
                   (PDFObject *)
                   local_98.
                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   .mCurrentPosition._M_node[1]._M_parent);
        psVar11 = PDFName::GetValue_abi_cxx11_
                            (*(PDFName **)
                              (local_98.
                               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               .mCurrentPosition._M_node + 1));
        AsEncodedName((string *)local_f8,(PDFDocumentHandler *)this_03,psVar11);
        this_00 = this->mDocumentContext;
        (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_50,inCommand);
        PDFHummus::DocumentContext::AddExtendedResourceMapping
                  (&local_118,this_00,(PDFFormXObject *)local_80._8_8_,&local_50,
                   (IResourceWritingTask *)this_01);
        local_d8._0_8_ = &local_c8;
        if ((_Rb_tree_node_base *)local_f8._0_8_ == (_Rb_tree_node_base *)(local_f8 + 0x10)) {
          local_c8._M_parent = (_Base_ptr)local_f8._24_8_;
        }
        else {
          local_d8._0_8_ = local_f8._0_8_;
        }
        local_c8._1_7_ = local_f8._17_7_;
        local_c8._M_color._0_1_ = local_f8[0x10];
        local_d8._8_8_ = local_f8._8_8_;
        local_f8._8_8_ = (ObjectsContext *)0x0;
        local_f8[0x10] = '\0';
        local_c8._M_left = (_Base_ptr)&local_a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == &local_118.field_2) {
          local_a8._8_8_ = local_118.field_2._8_8_;
        }
        else {
          local_c8._M_left = (_Base_ptr)local_118._M_dataplus._M_p;
        }
        local_a8._M_allocated_capacity._1_7_ = local_118.field_2._M_allocated_capacity._1_7_;
        local_a8._M_local_buf[0] = local_118.field_2._M_local_buf[0];
        local_c8._M_right = (_Base_ptr)local_118._M_string_length;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_f8._0_8_ = (_Rb_tree_node_base *)(local_f8 + 0x10);
        pVar16 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)local_80._M_allocated_capacity,
                            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_left != &local_a8) {
          operator_delete(local_c8._M_left,local_a8._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_node_base *)local_d8._0_8_ != &local_c8) {
          operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_node_base *)local_f8._0_8_ != (_Rb_tree_node_base *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
        pPVar14 = (PDFParser *)(pVar16.first._M_node._M_node + 2);
        std::__cxx11::string::_M_assign((string *)&this_01->mResourceName);
      }
    } while (local_98.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mCurrentPosition._M_node !=
             local_98.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mEndPosition._M_node);
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_70);
  return;
}

Assistant:

void PDFDocumentHandler::RegisterResourcesForResourcesCategory(PDFFormXObject* inTargetFormXObject,
                                                               ICategoryServicesCommand* inCommand,
                                                               PDFDictionary* inResourcesDictionary,
                                                               ObjectIDTypeList& ioObjectsToLaterCopy,
                                                               StringToStringMap& ioMappedResourcesNames)
{
    PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary(mParser->QueryDictionaryObject(
                                                                                    inResourcesDictionary,inCommand->GetResourcesCategoryName()));
    if(resourcesCategoryDictionary.GetPtr())
    {	
        MapIterator<PDFNameToPDFObjectMap> it(resourcesCategoryDictionary->GetIterator());
        while(it.MoveNext())
        {
            if(it.GetValue()->GetType() == PDFObject::ePDFObjectIndirectObjectReference)
            {
                PDFIndirectObjectReference* indirectReference = (PDFIndirectObjectReference*)(it.GetValue());
                ObjectIDTypeToObjectIDTypeMap::iterator	itObjects = mSourceToTarget.find(indirectReference->mObjectID);
                ObjectIDType targetObjectID;
                if(itObjects == mSourceToTarget.end())
                {
                    targetObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
                    mSourceToTarget.insert(ObjectIDTypeToObjectIDTypeMap::value_type(indirectReference->mObjectID,targetObjectID));
                    ioObjectsToLaterCopy.push_back(indirectReference->mObjectID);
                }
                else
                {
                    targetObjectID = itObjects->second;
                }
                ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            inCommand->RegisterInDirectResourceInFormResources(targetObjectID)));
            }
            else 
            {
                
                ResourceCopierTask* task = new ResourceCopierTask(inTargetFormXObject,this,it.GetValue());
                StringToStringMap::iterator itInsert = ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            mDocumentContext->AddExtendedResourceMapping(inTargetFormXObject, inCommand->GetResourcesCategoryName(),
                                                                                task))).first;
                task->SetResourceName(itInsert->second);
            }
        }
    }
}